

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

void __thiscall acto::core::runtime_t::execute(runtime_t *this)

{
  bool bVar1;
  bool bVar2;
  __pid_t _Var3;
  __int_type _Var4;
  __int_type _Var5;
  object_t *obj_00;
  worker_t *pwVar6;
  duration<long,_std::ratio<1L,_1L>_> *__d;
  worker_t *item_1;
  duration<long,_std::ratio<1L,_1L>_> local_d8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_d0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_c8;
  type local_b9;
  worker_t *local_b8;
  worker_t *item;
  sequence<acto::core::worker_t> idle_workers;
  duration<long,_std::ratio<1L,_1L>_> local_a0;
  void *local_98;
  int local_8c;
  duration<long,_std::ratio<1L,_1000L>_> local_88;
  duration local_80;
  object_t *local_78;
  object_t *obj;
  duration<long,_std::ratio<1L,_1L>_> local_68;
  __unspec local_5d;
  int local_5c;
  duration<long,_std::ratio<1L,_1L>_> local_58;
  type local_4d;
  int local_4c;
  duration<long,_std::ratio<1L,_1L>_> local_48;
  void *local_40;
  int local_34;
  worker_t *pwStack_30;
  wait_result result;
  worker_t *worker;
  anon_class_8_1_8991fb9c delete_worker;
  seconds new_worker_timeout;
  time_point last_cleanup_time;
  runtime_t *this_local;
  
  new_worker_timeout.__r = std::chrono::_V2::steady_clock::now();
  delete_worker.this = (runtime_t *)0x2;
  worker = (worker_t *)this;
  while (bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->active_), bVar1) {
    while (bVar1 = intrusive::queue<acto::core::object_t,_acto::intrusive::spin_lock>::empty
                             (&this->queue_), ((bVar1 ^ 0xffU) & 1) != 0) {
      pwStack_30 = intrusive::mpsc_stack<acto::core::worker_t>::pop(&(this->workers_).idle);
      if (pwStack_30 == (worker_t *)0x0) {
        _Var4 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)&this->workers_)
        ;
        _Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                          ((__atomic_base *)&(this->workers_).reserved);
        if (_Var4 < _Var5 + this->m_processors) {
          pwStack_30 = create_worker(this);
        }
        else {
          std::chrono::duration<long,std::ratio<1l,1000000000l>>::
          duration<long,std::ratio<1l,1l>,void>
                    ((duration<long,std::ratio<1l,1000000000l>> *)&local_40,
                     (duration<long,_std::ratio<1L,_1L>_> *)&delete_worker);
          local_34 = event::wait(&this->idle_workers_event_,local_40);
          pwStack_30 = intrusive::mpsc_stack<acto::core::worker_t>::pop(&(this->workers_).idle);
          if ((pwStack_30 == (worker_t *)0x0) && (local_34 == 2)) {
            local_4c = 2;
            std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                      ((duration<long,std::ratio<1l,1l>> *)&local_48,&local_4c);
            __d = &local_48;
            std::chrono::duration<long,_std::ratio<1L,_1L>_>::operator+=
                      ((duration<long,_std::ratio<1L,_1L>_> *)&delete_worker,__d);
            _Var4 = std::__atomic_base::operator_cast_to_unsigned_long
                              ((__atomic_base *)&this->workers_);
            if (_Var4 < 0x200) {
              pwStack_30 = create_worker(this);
            }
            else {
              event::wait(&this->idle_workers_event_,__d);
            }
          }
          else {
            local_5c = 2;
            std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                      ((duration<long,std::ratio<1l,1l>> *)&local_58,&local_5c);
            local_4d = (type)std::chrono::
                             operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<1L,_1L>_>
                                       ((duration<long,_std::ratio<1L,_1L>_> *)&delete_worker,
                                        &local_58);
            std::__cmp_cat::__unspec::__unspec(&local_5d,(__unspec *)0x0);
            bVar1 = std::operator>(local_4d);
            if (bVar1) {
              obj._4_4_ = 2;
              std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                        ((duration<long,std::ratio<1l,1l>> *)&local_68,(int *)((long)&obj + 4));
              std::chrono::duration<long,_std::ratio<1L,_1L>_>::operator-=
                        ((duration<long,_std::ratio<1L,_1L>_> *)&delete_worker,&local_68);
            }
          }
        }
      }
      if (pwStack_30 != (worker_t *)0x0) {
        obj_00 = intrusive::queue<acto::core::object_t,_acto::intrusive::spin_lock>::pop
                           (&this->queue_);
        pwVar6 = pwStack_30;
        local_78 = obj_00;
        if (obj_00 == (object_t *)0x0) {
          intrusive::mpsc_stack<acto::core::worker_t>::push(&(this->workers_).idle,pwStack_30);
        }
        else {
          local_8c = 500;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                    ((duration<long,std::ratio<1l,1000l>> *)&local_88,&local_8c);
          std::chrono::duration<long,std::ratio<1l,1000000000l>>::
          duration<long,std::ratio<1l,1000l>,void>
                    ((duration<long,std::ratio<1l,1000000000l>> *)&local_80,&local_88);
          worker_t::assign(pwVar6,obj_00,local_80);
        }
      }
    }
    bVar2 = std::atomic::operator_cast_to_bool((atomic *)&this->terminating_);
    bVar1 = true;
    if (!bVar2) {
      idle_workers.head_._4_4_ = 0x3c;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1l>> *)&local_a0,
                 (int *)((long)&idle_workers.head_ + 4));
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
                ((duration<long,std::ratio<1l,1000000000l>> *)&local_98,&local_a0);
      _Var3 = event::wait(&this->queue_event_,local_98);
      bVar1 = _Var3 == 2;
    }
    if (bVar1) {
      intrusive::mpsc_stack<acto::core::worker_t>::extract
                ((mpsc_stack<acto::core::worker_t> *)&item);
      while (local_b8 = intrusive::sequence<acto::core::worker_t>::pop_front
                                  ((sequence<acto::core::worker_t> *)&item),
            local_b8 != (worker_t *)0x0) {
        execute::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)&worker,local_b8);
      }
    }
    else {
      local_d0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_c8.__r = (rep)std::chrono::operator-
                                    (&local_d0,
                                     (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)&new_worker_timeout);
      item_1._4_4_ = 0x3c;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1l>> *)&local_d8,(int *)((long)&item_1 + 4));
      local_b9 = (type)std::chrono::
                       operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1L>_>
                                 (&local_c8,&local_d8);
      std::__cmp_cat::__unspec::__unspec((__unspec *)((long)&item_1 + 3),(__unspec *)0x0);
      bVar1 = std::operator>(local_b9);
      if (bVar1) {
        pwVar6 = intrusive::mpsc_stack<acto::core::worker_t>::pop(&(this->workers_).idle);
        if (pwVar6 != (worker_t *)0x0) {
          execute::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)&worker,pwVar6);
        }
        new_worker_timeout.__r = std::chrono::_V2::steady_clock::now();
      }
    }
  }
  return;
}

Assistant:

void runtime_t::execute() {
  auto last_cleanup_time = std::chrono::steady_clock::now();
  auto new_worker_timeout = std::chrono::seconds(2);

  auto delete_worker = [this](worker_t* const item) {
    delete item;
    // Уведомить, что удалены все вычислительные потоки
    if (--workers_.count == 0) {
      no_workers_event_.signaled();
    }
  };

  while (active_) {
    while (!queue_.empty()) {
      // Прежде чем извлекать объект из очереди, необходимо проверить,
      // что есть вычислительные ресурсы для его обработки
      worker_t* worker = workers_.idle.pop();

      if (!worker) {
        // Если текущее количество потоков меньше оптимального,
        // то создать новый поток
        if (workers_.count < (workers_.reserved + m_processors)) {
          worker = create_worker();
        } else {
          // Подождать некоторое время осовобождения какого-нибудь потока
          const wait_result result =
            idle_workers_event_.wait(new_worker_timeout);

          worker = workers_.idle.pop();

          if (!worker && (result == wait_result::timeout)) {
            new_worker_timeout += std::chrono::seconds(2);

            if (workers_.count < MAX_WORKERS) {
              worker = create_worker();
            } else {
              idle_workers_event_.wait();
            }
          } else if (new_worker_timeout > std::chrono::seconds(2)) {
            new_worker_timeout -= std::chrono::seconds(2);
          }
        }
      }

      if (worker) {
        if (object_t* const obj = queue_.pop()) {
          worker->assign(obj, std::chrono::milliseconds(500));
        } else {
          workers_.idle.push(worker);
        }
      }
    }

    if (terminating_ ||
        (queue_event_.wait(std::chrono::seconds(60)) == wait_result::timeout))
    {
      auto idle_workers = workers_.idle.extract();
      // Stop all idle threads.
      while (worker_t* const item = idle_workers.pop_front()) {
        delete_worker(item);
      }
    } else if ((std::chrono::steady_clock::now() - last_cleanup_time) >
               std::chrono::seconds(60))
    {
      if (worker_t* const item = workers_.idle.pop()) {
        delete_worker(item);
      }

      last_cleanup_time = std::chrono::steady_clock::now();
    }
  }
}